

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::IsGroupOf_PDU::Decode(IsGroupOf_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  GEDList *this_00;
  KUINT16 KVar1;
  GED_BasicRotorWingAircraft *pGVar2;
  KException *this_01;
  int iVar3;
  undefined7 in_register_00000011;
  byte bVar4;
  KString local_58;
  allocator<char> local_31;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (iVar3 + (uint)KVar1 < 0x28) {
    this_01 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Decode",&local_31);
    KException::KException(this_01,&local_58,2);
    __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
  }
  this_00 = &this->m_vpGED;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ::clear(this_00);
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_GroupedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_GroupedEntityID,stream);
  KDataStream::Read(stream,&this->m_ui8GrpdEntCat);
  KDataStream::Read(stream,&this->m_ui8NumOfGroupedEnts);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding1);
  KDataStream::Read<double>(stream,(double *)&this->m_f64GrpLat);
  KDataStream::Read<double>(stream,(double *)&this->m_f64GrpLon);
  bVar4 = 0;
  do {
    if (this->m_ui8NumOfGroupedEnts <= bVar4) {
      return;
    }
    switch(this->m_ui8GrpdEntCat) {
    case '\x01':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x28);
      DATA_TYPE::GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle
                ((GED_BasicGroundCombatVehicle *)pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    case '\x02':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
      DATA_TYPE::GED_EnhancedGroundCombatVehicle::GED_EnhancedGroundCombatVehicle
                ((GED_EnhancedGroundCombatVehicle *)pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    case '\x03':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x28);
      DATA_TYPE::GED_BasicGroundCombatSoldier::GED_BasicGroundCombatSoldier
                ((GED_BasicGroundCombatSoldier *)pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    case '\x04':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
      DATA_TYPE::GED_EnhancedGroundCombatSoldier::GED_EnhancedGroundCombatSoldier
                ((GED_EnhancedGroundCombatSoldier *)pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    case '\x05':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
      DATA_TYPE::GED_BasicRotorWingAircraft::GED_BasicRotorWingAircraft(pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    case '\x06':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
      DATA_TYPE::GED_EnhancedRotaryWingAircraft::GED_EnhancedRotaryWingAircraft
                ((GED_EnhancedRotaryWingAircraft *)pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    case '\a':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x28);
      DATA_TYPE::GED_BasicFixedWingAircraft::GED_BasicFixedWingAircraft
                ((GED_BasicFixedWingAircraft *)pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    case '\b':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
      DATA_TYPE::GED_EnhancedFixedWingAircraft::GED_EnhancedFixedWingAircraft
                ((GED_EnhancedFixedWingAircraft *)pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    case '\t':
      pGVar2 = (GED_BasicRotorWingAircraft *)operator_new(0x28);
      DATA_TYPE::GED_GroundLogisticsVehicle::GED_GroundLogisticsVehicle
                ((GED_GroundLogisticsVehicle *)pGVar2,stream);
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002159a8;
      local_58._M_string_length = (size_type)pGVar2;
      local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                  *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
      break;
    default:
      goto switchD_0013d29b_default;
    }
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr((KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_58);
switchD_0013d29b_default:
    bVar4 = bVar4 + 1;
  } while( true );
}

Assistant:

void IsGroupOf_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IS_GROUP_OF_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vpGED.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_GroupedEntityID
           >> m_ui8GrpdEntCat
           >> m_ui8NumOfGroupedEnts
           >> m_ui32Padding1
           >> m_f64GrpLat
           >> m_f64GrpLon;

    KUINT8 i = 0;

    while( i < m_ui8NumOfGroupedEnts )
    {
        switch( m_ui8GrpdEntCat )
        {
        case BasicGroundCombatVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicGroundCombatVehicle( stream ) ) );
            break;
        case EnhancedGroundCombatVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedGroundCombatVehicle( stream ) ) );
            break;
        case BasicGroundCombatSoldierGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicGroundCombatSoldier( stream ) ) );
            break;
        case EnhancedGroundCombatSoldierGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedGroundCombatSoldier( stream ) ) );
            break;
        case BasicRotorWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicRotorWingAircraft( stream ) ) );
            break;
        case EnhancedRotorWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedRotaryWingAircraft( stream ) ) );
            break;
        case BasicFixedWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicFixedWingAircraft( stream ) ) );
            break;
        case EnhancedFixedWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedFixedWingAircraft( stream ) ) );
            break;
        case GroundLogisticsVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_GroundLogisticsVehicle( stream ) ) );
            break;
        }
        ++i;
    }
}